

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void Fossilize::Instance::completedPipelineCompilation(void)

{
  long lVar1;
  
  lVar1 = __tls_get_addr(&PTR_0017cfc0);
  *(undefined8 *)(lVar1 + 8) = 0;
  *(undefined8 *)(lVar1 + 0x10) = 0;
  *(undefined8 *)(lVar1 + 0x18) = 0;
  *(undefined8 *)(lVar1 + 0x20) = 0;
  return;
}

Assistant:

void Instance::completedPipelineCompilation()
{
#ifdef FOSSILIZE_LAYER_CAPTURE_SIGSEGV
	tls_recorder = nullptr;
	tls_graphics_create_info = nullptr;
	tls_compute_create_info = nullptr;
	tls_raytracing_create_info = nullptr;
#endif
}